

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O2

void ihevc_intra_pred_chroma_mode_19_to_25
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  int iVar2;
  UWORD8 *pUVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  UWORD8 local_b8 [2];
  byte abStack_b6 [134];
  
  iVar1 = gai4_ihevc_ang_table_chroma[mode];
  iVar2 = gai4_ihevc_ang_table_chroma[(long)mode + 0x18];
  uVar8 = nt * 4;
  lVar4 = (long)(nt * 2 + -2);
  for (lVar9 = 0; lVar9 < nt * 2 + 2; lVar9 = lVar9 + 2) {
    local_b8[lVar9 + lVar4] = pu1_ref[lVar9 + (int)uVar8];
    local_b8[nt * 2 + -1 + (int)lVar9] = pu1_ref[lVar9 + (long)(int)uVar8 + 1];
  }
  iVar10 = iVar2 + 0x80;
  for (lVar9 = -2; (int)(iVar1 * nt >> 4 & 0xfffffffe) < lVar9; lVar9 = lVar9 + -2) {
    uVar7 = iVar10 >> 7 & 0xfffffffe;
    local_b8[lVar9 + lVar4] = pu1_ref[(int)(uVar8 - uVar7)];
    local_b8[lVar9 + lVar4 + 1] = pu1_ref[(int)((uVar8 | 1) - uVar7)];
    iVar10 = iVar10 + iVar2;
  }
  uVar6 = 0;
  uVar5 = (ulong)(uint)nt;
  if (nt < 1) {
    uVar5 = uVar6;
  }
  pUVar3 = pu1_dst + 1;
  while (uVar6 != uVar5) {
    uVar6 = uVar6 + 1;
    uVar8 = iVar1 * (int)uVar6;
    uVar7 = uVar8 & 0x1f;
    lVar9 = (int)((int)uVar8 >> 4 & 0xfffffffe) + lVar4;
    for (lVar11 = 0; lVar11 < nt * 2; lVar11 = lVar11 + 2) {
      pUVar3[lVar11 + -1] =
           (UWORD8)((uint)local_b8[lVar11 + lVar9 + 2] * (0x20 - uVar7) +
                    local_b8[lVar11 + lVar9 + 4] * uVar7 + 0x10 >> 5);
      pUVar3[lVar11] =
           (UWORD8)((uint)local_b8[lVar11 + lVar9 + 3] * (0x20 - uVar7) +
                    local_b8[lVar11 + lVar9 + 5] * uVar7 + 0x10 >> 5);
    }
    pUVar3 = pUVar3 + dst_strd;
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_19_to_25(UWORD8 *pu1_ref,
                                           WORD32 src_strd,
                                           UWORD8 *pu1_dst,
                                           WORD32 dst_strd,
                                           WORD32 nt,
                                           WORD32 mode)
{

    WORD32 row, col, k;
    WORD32 intra_pred_ang, idx;
    WORD32 inv_ang, inv_ang_sum, pos, fract;
    WORD32 ref_main_idx_u, ref_main_idx_v, ref_idx;
    UWORD8 ref_temp[(2 * MAX_CU_SIZE) + 2];
    UWORD8 *ref_main;
    UNUSED(src_strd);


    intra_pred_ang = gai4_ihevc_ang_table_chroma[mode];
    inv_ang = gai4_ihevc_inv_ang_table_chroma[mode - 12];

    /* Intermediate reference samples for negative angle modes */
    /* This have to be removed during optimization*/
    /* For horizontal modes, (ref main = ref above) (ref side = ref left) */
    ref_main = ref_temp + 2 * nt;
    for(k = 0; k < (2 * (nt + 1)); k += 2)
    {
        ref_temp[k + (2 * (nt - 1))] = pu1_ref[(4 * nt) + k];
        ref_temp[k + 1 + (2 * (nt - 1))] = pu1_ref[(4 * nt) + k + 1];
    }


    ref_idx = (nt * intra_pred_ang) >> 5;
    inv_ang_sum = 128;
    ref_main = ref_temp + (2 * (nt - 1));
    /* SIMD Optimization can be done using look-up table for the loop */
    /* For negative angled derive the main reference samples from side */
    /*  reference samples refer to section 8.4.4.2.6 */
    for(k = -2; k > (2 * ref_idx); k -= 2)
    {
        inv_ang_sum += inv_ang;
        ref_main[k] = pu1_ref[(4 * nt) - (inv_ang_sum >> 8) * 2];
        ref_main[k + 1] = pu1_ref[((4 * nt) + 1) - (inv_ang_sum >> 8) * 2];
    }

    for(row = 0; row < nt; row++)
    {
        pos = ((row + 1) * intra_pred_ang);
        idx = pos >> 5;
        fract = pos & (31);

        // Do linear filtering
        for(col = 0; col < (2 * nt); col += 2)
        {
            ref_main_idx_u = col + 2 * idx + 2;
            ref_main_idx_v = (col + 1) + 2 * idx + 2;
            pu1_dst[(row * dst_strd) + col] = (UWORD8)(((32 - fract)
                            * ref_main[ref_main_idx_u]
                            + fract * ref_main[ref_main_idx_u + 2] + 16) >> 5);
            pu1_dst[(row * dst_strd) + (col + 1)] = (UWORD8)(((32 - fract)
                            * ref_main[ref_main_idx_v]
                            + fract * ref_main[ref_main_idx_v + 2] + 16) >> 5);

        }

    }

}